

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

int32 __thiscall rw::MaterialList::findIndex(MaterialList *this,Material *mat)

{
  int32 i;
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (this->numMaterials <= lVar1) {
      return -1;
    }
    if (this->materials[lVar1] == mat) break;
    lVar1 = lVar1 + 1;
  }
  return (int32)lVar1;
}

Assistant:

int32
MaterialList::findIndex(Material *mat)
{
	for(int32 i = 0; i < this->numMaterials; i++)
		if(this->materials[i] == mat)
			return i;
	return -1;
}